

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_compute_blob.h
# Opt level: O1

void ncnn::gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined8 uVar4;
  undefined4 uVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  int *piVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  int iVar28;
  float fVar35;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  int iVar36;
  int iVar37;
  int iVar38;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar39;
  int iVar42;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  long local_90;
  
  iVar17 = grid->h * grid->w * grid->d;
  piVar24 = (int *)offset_value->data;
  if (permute_fusion == 0) {
    if (0 < grid->c) {
      sVar8 = grid->cstep;
      local_90 = (long)grid->data + 8;
      sVar9 = grid->elemsize;
      lVar11 = 0;
      do {
        if (0 < iVar17) {
          lVar23 = 0;
          do {
            iVar16 = src->d;
            fVar43 = (float)(iVar16 + -1) * (*(float *)(local_90 + lVar23 * 4) * 0.5 + 0.5);
            uVar4 = *(undefined8 *)(local_90 + -8 + lVar23 * 4);
            uVar3 = src->w;
            uVar6 = src->h;
            fVar25 = (float)(uVar3 + -1) * ((float)uVar4 * 0.5 + 0.5);
            fVar35 = (float)(uVar6 + -1) * ((float)((ulong)uVar4 >> 0x20) * 0.5 + 0.5);
            fVar26 = floorf(fVar25);
            fVar27 = floorf(fVar35);
            iVar28 = (int)fVar26;
            iVar36 = (int)fVar27;
            iVar37 = (int)extraout_XMM0_Db_01;
            iVar38 = (int)extraout_XMM0_Db_02;
            fVar26 = floorf(fVar43);
            iVar10 = (int)fVar26;
            iVar1 = iVar10 + 1;
            bVar15 = iVar10 < iVar16 && -1 < iVar10;
            auVar32._0_4_ = -(uint)(-1 < iVar28);
            auVar32._4_4_ = -(uint)(-1 < iVar36);
            auVar32._8_4_ = -(uint)(-1 < iVar37);
            auVar32._12_4_ = -(uint)(-1 < iVar38);
            auVar41._0_4_ = -(uint)(iVar28 < (int)uVar3);
            auVar41._4_4_ = -(uint)(iVar36 < (int)uVar6);
            auVar41._8_4_ = -(uint)(iVar37 < 0);
            auVar41._12_4_ = -(uint)(iVar38 < 0);
            auVar41 = auVar41 & auVar32;
            auVar33._0_8_ = auVar41._0_8_;
            auVar33._8_4_ = auVar41._4_4_;
            auVar33._12_4_ = auVar41._12_4_;
            auVar34._0_8_ = auVar33._0_8_ << 0x3f;
            auVar34._8_8_ = auVar33._8_8_ << 0x3f;
            uVar12 = movmskpd((int)CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),-1 < iVar10),auVar34
                             );
            uVar20 = uVar12 >> 1 & 0x7f;
            uVar14 = uVar20 & uVar12 & 1;
            iVar21 = -1;
            iVar18 = -1;
            uVar19 = (uint)bVar15;
            if ((uVar14 & uVar19) != 0) {
              iVar18 = (uVar3 * (iVar36 + uVar6 * iVar10) + iVar28) * src->elempack;
            }
            iVar39 = iVar28 + 1;
            iVar42 = iVar36 + 1;
            auVar47._0_4_ = -(uint)(-2 < iVar28);
            auVar47._4_4_ = -(uint)(-2 < iVar36);
            auVar47._8_4_ = -(uint)(0 < iVar37);
            auVar47._12_4_ = -(uint)(0 < iVar38);
            auVar51._0_4_ = -(uint)(iVar39 < (int)uVar3);
            auVar51._4_4_ = -(uint)(iVar42 < (int)uVar6);
            auVar51._8_4_ = -(uint)(iVar37 + 1 < 0);
            auVar51._12_4_ = -(uint)(iVar38 + 1 < 0);
            auVar51 = auVar51 & auVar47;
            auVar48._0_8_ = auVar51._0_8_;
            auVar48._8_4_ = auVar51._4_4_;
            auVar48._12_4_ = auVar51._12_4_;
            auVar49._0_8_ = auVar48._0_8_ << 0x3f;
            auVar49._8_8_ = auVar48._8_8_ << 0x3f;
            uVar13 = movmskpd(iVar28,auVar49);
            uVar20 = uVar20 & uVar13 & 1;
            *piVar24 = iVar18;
            if ((uVar20 & uVar19) != 0) {
              iVar21 = ((iVar36 + src->h * iVar10) * src->w + iVar39) * src->elempack;
            }
            uVar22 = uVar13 >> 1 & 0x7f;
            uVar12 = uVar12 & 1 & uVar22;
            piVar24[1] = iVar21;
            iVar21 = -1;
            iVar18 = -1;
            uVar19 = (uint)bVar15;
            if ((uVar12 & uVar19) != 0) {
              iVar18 = ((iVar42 + src->h * iVar10) * src->w + iVar28) * src->elempack;
            }
            uVar22 = uVar22 & uVar13 & 1;
            piVar24[2] = iVar18;
            if ((uVar22 & uVar19) != 0) {
              iVar21 = ((iVar42 + src->h * iVar10) * src->w + iVar39) * src->elempack;
            }
            bVar15 = -2 < iVar10 && iVar1 < iVar16;
            piVar24[3] = iVar21;
            iVar18 = -1;
            iVar16 = -1;
            uVar19 = (uint)bVar15;
            if ((uVar14 & uVar19) != 0) {
              iVar16 = ((iVar36 + src->h * iVar1) * src->w + iVar28) * src->elempack;
            }
            piVar24[4] = iVar16;
            if ((uVar20 & uVar19) != 0) {
              iVar18 = ((iVar36 + src->h * iVar1) * src->w + iVar39) * src->elempack;
            }
            piVar24[5] = iVar18;
            iVar18 = -1;
            iVar16 = -1;
            uVar19 = (uint)bVar15;
            if ((uVar12 & uVar19) != 0) {
              iVar16 = ((iVar42 + src->h * iVar1) * src->w + iVar28) * src->elempack;
            }
            piVar24[6] = iVar16;
            if ((uVar22 & uVar19) != 0) {
              iVar18 = ((iVar42 + iVar1 * src->h) * src->w + iVar39) * src->elempack;
            }
            piVar24[7] = iVar18;
            *(ulong *)(piVar24 + 8) = CONCAT44(fVar35 - (float)iVar36,fVar25 - (float)iVar28);
            piVar24[10] = (int)(fVar43 - (float)iVar10);
            piVar24 = piVar24 + 0xb;
            lVar23 = lVar23 + 3;
          } while ((int)lVar23 < iVar17);
        }
        lVar11 = lVar11 + 1;
        local_90 = local_90 + sVar8 * sVar9;
      } while (lVar11 < grid->c);
    }
  }
  else if (0 < iVar17) {
    pvVar7 = grid->data;
    lVar11 = grid->elemsize * grid->cstep;
    lVar23 = 0;
    do {
      iVar16 = src->d;
      fVar43 = (float)(iVar16 + -1) *
               (*(float *)((long)pvVar7 + lVar23 * 4 + lVar11 * 2) * 0.5 + 0.5);
      uVar2 = src->w;
      uVar5 = src->h;
      fVar25 = (float)(uVar2 + -1) * (*(float *)((long)pvVar7 + lVar23 * 4) * 0.5 + 0.5);
      fVar35 = (float)(uVar5 + -1) * (*(float *)((long)pvVar7 + lVar23 * 4 + lVar11) * 0.5 + 0.5);
      fVar26 = floorf(fVar25);
      fVar27 = floorf(fVar35);
      iVar28 = (int)fVar26;
      iVar36 = (int)fVar27;
      iVar37 = (int)extraout_XMM0_Db;
      iVar38 = (int)extraout_XMM0_Db_00;
      fVar26 = floorf(fVar43);
      iVar10 = (int)fVar26;
      iVar1 = iVar10 + 1;
      bVar15 = iVar10 < iVar16 && -1 < iVar10;
      auVar29._0_4_ = -(uint)(-1 < iVar28);
      auVar29._4_4_ = -(uint)(-1 < iVar36);
      auVar29._8_4_ = -(uint)(-1 < iVar37);
      auVar29._12_4_ = -(uint)(-1 < iVar38);
      auVar40._0_4_ = -(uint)(iVar28 < (int)uVar2);
      auVar40._4_4_ = -(uint)(iVar36 < (int)uVar5);
      auVar40._8_4_ = -(uint)(iVar37 < 0);
      auVar40._12_4_ = -(uint)(iVar38 < 0);
      auVar40 = auVar40 & auVar29;
      auVar30._0_8_ = auVar40._0_8_;
      auVar30._8_4_ = auVar40._4_4_;
      auVar30._12_4_ = auVar40._12_4_;
      auVar31._0_8_ = auVar30._0_8_ << 0x3f;
      auVar31._8_8_ = auVar30._8_8_ << 0x3f;
      uVar12 = movmskpd((int)CONCAT71((int7)((ulong)extraout_RDX >> 8),-1 < iVar10),auVar31);
      uVar19 = uVar12 >> 1 & 0x7f;
      uVar20 = uVar19 & uVar12 & 1;
      iVar21 = -1;
      iVar18 = -1;
      uVar14 = (uint)bVar15;
      if ((uVar20 & uVar14) != 0) {
        iVar18 = (uVar2 * (iVar36 + uVar5 * iVar10) + iVar28) * src->elempack;
      }
      iVar39 = iVar28 + 1;
      iVar42 = iVar36 + 1;
      auVar44._0_4_ = -(uint)(-2 < iVar28);
      auVar44._4_4_ = -(uint)(-2 < iVar36);
      auVar44._8_4_ = -(uint)(0 < iVar37);
      auVar44._12_4_ = -(uint)(0 < iVar38);
      auVar50._0_4_ = -(uint)(iVar39 < (int)uVar2);
      auVar50._4_4_ = -(uint)(iVar42 < (int)uVar5);
      auVar50._8_4_ = -(uint)(iVar37 + 1 < 0);
      auVar50._12_4_ = -(uint)(iVar38 + 1 < 0);
      auVar50 = auVar50 & auVar44;
      auVar45._0_8_ = auVar50._0_8_;
      auVar45._8_4_ = auVar50._4_4_;
      auVar45._12_4_ = auVar50._12_4_;
      auVar46._0_8_ = auVar45._0_8_ << 0x3f;
      auVar46._8_8_ = auVar45._8_8_ << 0x3f;
      uVar13 = movmskpd(iVar28,auVar46);
      uVar19 = uVar19 & uVar13 & 1;
      *piVar24 = iVar18;
      if ((uVar19 & uVar14) != 0) {
        iVar21 = ((iVar36 + src->h * iVar10) * src->w + iVar39) * src->elempack;
      }
      uVar14 = uVar13 >> 1 & 0x7f;
      uVar12 = uVar12 & 1 & uVar14;
      piVar24[1] = iVar21;
      iVar21 = -1;
      iVar18 = -1;
      uVar22 = (uint)bVar15;
      if ((uVar12 & uVar22) != 0) {
        iVar18 = ((iVar42 + src->h * iVar10) * src->w + iVar28) * src->elempack;
      }
      uVar14 = uVar14 & uVar13 & 1;
      piVar24[2] = iVar18;
      if ((uVar14 & uVar22) != 0) {
        iVar21 = ((iVar42 + src->h * iVar10) * src->w + iVar39) * src->elempack;
      }
      bVar15 = -2 < iVar10 && iVar1 < iVar16;
      piVar24[3] = iVar21;
      iVar18 = -1;
      iVar16 = -1;
      uVar13 = (uint)bVar15;
      if ((uVar20 & uVar13) != 0) {
        iVar16 = ((iVar36 + src->h * iVar1) * src->w + iVar28) * src->elempack;
      }
      piVar24[4] = iVar16;
      if ((uVar19 & uVar13) != 0) {
        iVar18 = ((iVar36 + src->h * iVar1) * src->w + iVar39) * src->elempack;
      }
      piVar24[5] = iVar18;
      iVar18 = -1;
      iVar16 = -1;
      uVar19 = (uint)bVar15;
      if ((uVar12 & uVar19) != 0) {
        iVar16 = ((iVar42 + src->h * iVar1) * src->w + iVar28) * src->elempack;
      }
      piVar24[6] = iVar16;
      if ((uVar14 & uVar19) != 0) {
        iVar18 = ((iVar42 + iVar1 * src->h) * src->w + iVar39) * src->elempack;
      }
      piVar24[7] = iVar18;
      *(ulong *)(piVar24 + 8) = CONCAT44(fVar35 - (float)iVar36,fVar25 - (float)iVar28);
      piVar24[10] = (int)(fVar43 - (float)iVar10);
      piVar24 = piVar24 + 0xb;
      lVar23 = lVar23 + 1;
    } while (iVar17 != (int)lVar23);
  }
  return;
}

Assistant:

void gridsample_3d_bilinear_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h * grid.d;

    float* offset_value_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 23 < grid_size; x += 24)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);
                __m256 gz = _mm256_loadu_ps(gridptr + 16);

                transpose3x8_ps(gx, gy, gz);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gx = get_coord(_mm256_set1_ps(src.w), gx);

                gy = unormalize(_mm256_set1_ps(src.h), gy);
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                gz = unormalize(_mm256_set1_ps(src.d), gz);
                gz = get_coord(_mm256_set1_ps(src.d), gz);

                __m256 x_w = _mm256_floor_ps(gx);
                __m256 y_n = _mm256_floor_ps(gy);
                __m256 z_t = _mm256_floor_ps(gz);

                __m256 x1 = _mm256_add_ps(x_w, _mm256_set1_ps(1));
                __m256 y1 = _mm256_add_ps(y_n, _mm256_set1_ps(1));
                __m256 z1 = _mm256_add_ps(z_t, _mm256_set1_ps(1));

                __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(x_w, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x_w, _CMP_GT_OS));
                __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(x1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x1, _CMP_GT_OS));
                __m256 y0_in_range = _mm256_and_ps(_mm256_cmp_ps(y_n, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y_n, _CMP_GT_OS));
                __m256 y1_in_range = _mm256_and_ps(_mm256_cmp_ps(y1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y1, _CMP_GT_OS));
                __m256 z0_in_range = _mm256_and_ps(_mm256_cmp_ps(z_t, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), z_t, _CMP_GT_OS));
                __m256 z1_in_range = _mm256_and_ps(_mm256_cmp_ps(z1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), z1, _CMP_GT_OS));

                __m256 v000_in_range, v010_in_range, v100_in_range, v110_in_range, v001_in_range, v011_in_range, v101_in_range, v111_in_range;
                {
                    __m256 v00_in_range = _mm256_and_ps(x0_in_range, y0_in_range);
                    __m256 v01_in_range = _mm256_and_ps(x1_in_range, y0_in_range);
                    __m256 v10_in_range = _mm256_and_ps(x0_in_range, y1_in_range);
                    __m256 v11_in_range = _mm256_and_ps(x1_in_range, y1_in_range);

                    v000_in_range = _mm256_and_ps(v00_in_range, z0_in_range);
                    v001_in_range = _mm256_and_ps(v01_in_range, z0_in_range);
                    v010_in_range = _mm256_and_ps(v10_in_range, z0_in_range);
                    v011_in_range = _mm256_and_ps(v11_in_range, z0_in_range);

                    v100_in_range = _mm256_and_ps(v00_in_range, z1_in_range);
                    v101_in_range = _mm256_and_ps(v01_in_range, z1_in_range);
                    v110_in_range = _mm256_and_ps(v10_in_range, z1_in_range);
                    v111_in_range = _mm256_and_ps(v11_in_range, z1_in_range);
                }

                __m256 tnw_offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), z_t,
                                                  _mm256_comp_fmadd_ps(y_n, _mm256_set1_ps(src.w), x_w)),
                                                  _mm256_set1_ps(src.elempack));
                __m256 tne_offset = _mm256_add_ps(tnw_offset, _mm256_set1_ps(src.elempack));
                __m256 tsw_offset = _mm256_add_ps(tnw_offset, _mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack)));
                __m256 tse_offset = _mm256_add_ps(tsw_offset, _mm256_set1_ps(src.elempack));

                __m256 bnw_offset = _mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), _mm256_set1_ps(src.elempack), tnw_offset);
                __m256 bne_offset = _mm256_add_ps(bnw_offset, _mm256_set1_ps(src.elempack));
                __m256 bsw_offset = _mm256_add_ps(bnw_offset, _mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack)));
                __m256 bse_offset = _mm256_add_ps(bsw_offset, _mm256_set1_ps(src.elempack));

                tnw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tnw_offset, v000_in_range);
                tne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tne_offset, v001_in_range);
                tsw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tsw_offset, v010_in_range);
                tse_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tse_offset, v011_in_range);

                bnw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bnw_offset, v100_in_range);
                bne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bne_offset, v101_in_range);
                bsw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bsw_offset, v110_in_range);
                bse_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bse_offset, v111_in_range);

                tnw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tnw_offset));
                tne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tne_offset));
                tsw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tsw_offset));
                tse_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tse_offset));

                bnw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bnw_offset));
                bne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bne_offset));
                bsw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bsw_offset));
                bse_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bse_offset));

                __m256 alpha = _mm256_sub_ps(gx, x_w);
                __m256 beta = _mm256_sub_ps(gy, y_n);
                __m256 gamma = _mm256_sub_ps(gz, z_t);

                transpose8x11_ps(tnw_offset, tne_offset, tsw_offset, tse_offset, bnw_offset, bne_offset, bsw_offset, bse_offset, alpha, beta, gamma);

                _mm256_storeu_ps(offset_value_ptr, tnw_offset);
                _mm256_storeu_ps(offset_value_ptr + 8, tne_offset);
                _mm256_storeu_ps(offset_value_ptr + 16, tsw_offset);
                _mm256_storeu_ps(offset_value_ptr + 24, tse_offset);

                _mm256_storeu_ps(offset_value_ptr + 32, bnw_offset);
                _mm256_storeu_ps(offset_value_ptr + 40, bne_offset);
                _mm256_storeu_ps(offset_value_ptr + 48, bsw_offset);
                _mm256_storeu_ps(offset_value_ptr + 56, bse_offset);

                _mm256_storeu_ps(offset_value_ptr + 64, alpha);
                _mm256_storeu_ps(offset_value_ptr + 72, beta);
                _mm256_storeu_ps(offset_value_ptr + 80, gamma);

                gridptr += 24;

                offset_value_ptr += 88;
            }
#endif // __AVX__

            for (; x < grid_size; x += 3)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);
                float sample_z = *(gridptr + 2);

                sample_x = unormalize(src.w, sample_x);
                sample_x = get_coord(src.w, sample_x);

                sample_y = unormalize(src.h, sample_y);
                sample_y = get_coord(src.h, sample_y);

                sample_z = unormalize(src.d, sample_z);
                sample_z = get_coord(src.d, sample_z);

                int x0 = (int)floorf(sample_x);
                int y0 = (int)floorf(sample_y);
                int z0 = (int)floorf(sample_z);
                int x1 = x0 + 1;
                int y1 = y0 + 1;
                int z1 = z0 + 1;

                bool x0_in_range = (x0 > -1) & (x0 < src.w);
                bool y0_in_range = (y0 > -1) & (y0 < src.h);
                bool z0_in_range = (z0 > -1) & (z0 < src.d);
                bool x1_in_range = (x1 > -1) & (x1 < src.w);
                bool y1_in_range = (y1 > -1) & (y1 < src.h);
                bool z1_in_range = (z1 > -1) & (z1 < src.d);

                bool v00_in_range = x0_in_range & y0_in_range;
                bool v01_in_range = x1_in_range & y0_in_range;
                bool v10_in_range = x0_in_range & y1_in_range;
                bool v11_in_range = x1_in_range & y1_in_range;

                bool in_bound_000 = v00_in_range & z0_in_range;
                bool in_bound_001 = v01_in_range & z0_in_range;
                bool in_bound_010 = v10_in_range & z0_in_range;
                bool in_bound_011 = v11_in_range & z0_in_range;

                bool in_bound_100 = v00_in_range & z1_in_range;
                bool in_bound_101 = v01_in_range & z1_in_range;
                bool in_bound_110 = v10_in_range & z1_in_range;
                bool in_bound_111 = v11_in_range & z1_in_range;

                int* offset_ptr = (int*)offset_value_ptr;
                float* value_ptr = offset_value_ptr + 8;

                offset_ptr[0] = in_bound_000 ? (x0 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[1] = in_bound_001 ? (x1 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[2] = in_bound_010 ? (x0 + y1 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[3] = in_bound_011 ? (x1 + y1 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;

                offset_ptr[4] = in_bound_100 ? (x0 + y0 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[5] = in_bound_101 ? (x1 + y0 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[6] = in_bound_110 ? (x0 + y1 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[7] = in_bound_111 ? (x1 + y1 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;

                value_ptr[0] = sample_x - x0;
                value_ptr[1] = sample_y - y0;
                value_ptr[2] = sample_z - z0;

                gridptr += 3;
                offset_value_ptr += 11;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);
        const float* gridptr_z = grid.channel(2);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);
            __m256 gz = _mm256_loadu_ps(gridptr_z);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gx = get_coord(_mm256_set1_ps(src.w), gx);

            gy = unormalize(_mm256_set1_ps(src.h), gy);
            gy = get_coord(_mm256_set1_ps(src.h), gy);

            gz = unormalize(_mm256_set1_ps(src.d), gz);
            gz = get_coord(_mm256_set1_ps(src.d), gz);

            __m256 x_w = _mm256_floor_ps(gx);
            __m256 y_n = _mm256_floor_ps(gy);
            __m256 z_t = _mm256_floor_ps(gz);

            __m256 x1 = _mm256_add_ps(x_w, _mm256_set1_ps(1));
            __m256 y1 = _mm256_add_ps(y_n, _mm256_set1_ps(1));
            __m256 z1 = _mm256_add_ps(z_t, _mm256_set1_ps(1));

            __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(x_w, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x_w, _CMP_GT_OS));
            __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(x1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x1, _CMP_GT_OS));
            __m256 y0_in_range = _mm256_and_ps(_mm256_cmp_ps(y_n, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y_n, _CMP_GT_OS));
            __m256 y1_in_range = _mm256_and_ps(_mm256_cmp_ps(y1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y1, _CMP_GT_OS));
            __m256 z0_in_range = _mm256_and_ps(_mm256_cmp_ps(z_t, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), z_t, _CMP_GT_OS));
            __m256 z1_in_range = _mm256_and_ps(_mm256_cmp_ps(z1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), z1, _CMP_GT_OS));

            __m256 v000_in_range, v010_in_range, v100_in_range, v110_in_range, v001_in_range, v011_in_range, v101_in_range, v111_in_range;
            {
                __m256 v00_in_range = _mm256_and_ps(x0_in_range, y0_in_range);
                __m256 v01_in_range = _mm256_and_ps(x1_in_range, y0_in_range);
                __m256 v10_in_range = _mm256_and_ps(x0_in_range, y1_in_range);
                __m256 v11_in_range = _mm256_and_ps(x1_in_range, y1_in_range);

                v000_in_range = _mm256_and_ps(v00_in_range, z0_in_range);
                v001_in_range = _mm256_and_ps(v01_in_range, z0_in_range);
                v010_in_range = _mm256_and_ps(v10_in_range, z0_in_range);
                v011_in_range = _mm256_and_ps(v11_in_range, z0_in_range);

                v100_in_range = _mm256_and_ps(v00_in_range, z1_in_range);
                v101_in_range = _mm256_and_ps(v01_in_range, z1_in_range);
                v110_in_range = _mm256_and_ps(v10_in_range, z1_in_range);
                v111_in_range = _mm256_and_ps(v11_in_range, z1_in_range);
            }

            __m256 tnw_offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), z_t,
                                              _mm256_comp_fmadd_ps(y_n, _mm256_set1_ps(src.w), x_w)),
                                              _mm256_set1_ps(src.elempack));
            __m256 tne_offset = _mm256_add_ps(tnw_offset, _mm256_set1_ps(src.elempack));
            __m256 tsw_offset = _mm256_add_ps(tnw_offset, _mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack)));
            __m256 tse_offset = _mm256_add_ps(tsw_offset, _mm256_set1_ps(src.elempack));

            __m256 bnw_offset = _mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), _mm256_set1_ps(src.elempack), tnw_offset);
            __m256 bne_offset = _mm256_add_ps(bnw_offset, _mm256_set1_ps(src.elempack));
            __m256 bsw_offset = _mm256_add_ps(bnw_offset, _mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack)));
            __m256 bse_offset = _mm256_add_ps(bsw_offset, _mm256_set1_ps(src.elempack));

            tnw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tnw_offset, v000_in_range);
            tne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tne_offset, v001_in_range);
            tsw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tsw_offset, v010_in_range);
            tse_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tse_offset, v011_in_range);

            bnw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bnw_offset, v100_in_range);
            bne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bne_offset, v101_in_range);
            bsw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bsw_offset, v110_in_range);
            bse_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bse_offset, v111_in_range);

            tnw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tnw_offset));
            tne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tne_offset));
            tsw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tsw_offset));
            tse_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tse_offset));

            bnw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bnw_offset));
            bne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bne_offset));
            bsw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bsw_offset));
            bse_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bse_offset));

            __m256 alpha = _mm256_sub_ps(gx, x_w);
            __m256 beta = _mm256_sub_ps(gy, y_n);
            __m256 gamma = _mm256_sub_ps(gz, z_t);

            transpose8x11_ps(tnw_offset, tne_offset, tsw_offset, tse_offset, bnw_offset, bne_offset, bsw_offset, bse_offset, alpha, beta, gamma);

            _mm256_storeu_ps(offset_value_ptr, tnw_offset);
            _mm256_storeu_ps(offset_value_ptr + 8, tne_offset);
            _mm256_storeu_ps(offset_value_ptr + 16, tsw_offset);
            _mm256_storeu_ps(offset_value_ptr + 24, tse_offset);

            _mm256_storeu_ps(offset_value_ptr + 32, bnw_offset);
            _mm256_storeu_ps(offset_value_ptr + 40, bne_offset);
            _mm256_storeu_ps(offset_value_ptr + 48, bsw_offset);
            _mm256_storeu_ps(offset_value_ptr + 56, bse_offset);

            _mm256_storeu_ps(offset_value_ptr + 64, alpha);
            _mm256_storeu_ps(offset_value_ptr + 72, beta);
            _mm256_storeu_ps(offset_value_ptr + 80, gamma);

            gridptr_x += 8;
            gridptr_y += 8;
            gridptr_z += 8;

            offset_value_ptr += 88;
        }
#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;
            float sample_z = *gridptr_z;

            sample_x = unormalize(src.w, sample_x);
            sample_x = get_coord(src.w, sample_x);

            sample_y = unormalize(src.h, sample_y);
            sample_y = get_coord(src.h, sample_y);

            sample_z = unormalize(src.d, sample_z);
            sample_z = get_coord(src.d, sample_z);

            int x0 = (int)floorf(sample_x);
            int y0 = (int)floorf(sample_y);
            int z0 = (int)floorf(sample_z);
            int x1 = x0 + 1;
            int y1 = y0 + 1;
            int z1 = z0 + 1;

            bool x0_in_range = (x0 > -1) & (x0 < src.w);
            bool y0_in_range = (y0 > -1) & (y0 < src.h);
            bool z0_in_range = (z0 > -1) & (z0 < src.d);
            bool x1_in_range = (x1 > -1) & (x1 < src.w);
            bool y1_in_range = (y1 > -1) & (y1 < src.h);
            bool z1_in_range = (z1 > -1) & (z1 < src.d);

            bool v00_in_range = x0_in_range & y0_in_range;
            bool v01_in_range = x1_in_range & y0_in_range;
            bool v10_in_range = x0_in_range & y1_in_range;
            bool v11_in_range = x1_in_range & y1_in_range;

            bool in_bound_000 = v00_in_range & z0_in_range;
            bool in_bound_001 = v01_in_range & z0_in_range;
            bool in_bound_010 = v10_in_range & z0_in_range;
            bool in_bound_011 = v11_in_range & z0_in_range;

            bool in_bound_100 = v00_in_range & z1_in_range;
            bool in_bound_101 = v01_in_range & z1_in_range;
            bool in_bound_110 = v10_in_range & z1_in_range;
            bool in_bound_111 = v11_in_range & z1_in_range;

            int* offset_ptr = (int*)offset_value_ptr;
            float* value_ptr = offset_value_ptr + 8;

            offset_ptr[0] = in_bound_000 ? (x0 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[1] = in_bound_001 ? (x1 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[2] = in_bound_010 ? (x0 + y1 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[3] = in_bound_011 ? (x1 + y1 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;

            offset_ptr[4] = in_bound_100 ? (x0 + y0 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[5] = in_bound_101 ? (x1 + y0 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[6] = in_bound_110 ? (x0 + y1 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[7] = in_bound_111 ? (x1 + y1 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;

            value_ptr[0] = sample_x - x0;
            value_ptr[1] = sample_y - y0;
            value_ptr[2] = sample_z - z0;

            gridptr_x++;
            gridptr_y++;
            gridptr_z++;
            offset_value_ptr += 11;
        }
    }
}